

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O0

void __thiscall
OpenMD::MatrixAccumulator::get95percentConfidenceInterval(MatrixAccumulator *this,ResultType *ret)

{
  double dVar1;
  undefined8 uVar2;
  double *pdVar3;
  RectMatrix<double,_3U,_3U> *in_RSI;
  long in_RDI;
  double dVar4;
  undefined1 auVar5 [16];
  uint j;
  uint i;
  Mat3x3d sd;
  uint local_6c;
  uint local_68;
  ResultType *in_stack_ffffffffffffffd8;
  MatrixAccumulator *in_stack_ffffffffffffffe0;
  
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x255d33);
  getStdDev(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  for (local_68 = 0; local_68 < 3; local_68 = local_68 + 1) {
    for (local_6c = 0; local_6c < 3; local_6c = local_6c + 1) {
      pdVar3 = RectMatrix<double,_3U,_3U>::operator()
                         ((RectMatrix<double,_3U,_3U> *)&stack0xffffffffffffffa8,local_68,local_6c);
      dVar1 = *pdVar3;
      uVar2 = *(undefined8 *)(in_RDI + 8);
      auVar5._8_4_ = (int)((ulong)uVar2 >> 0x20);
      auVar5._0_8_ = uVar2;
      auVar5._12_4_ = 0x45300000;
      dVar4 = sqrt((auVar5._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0));
      pdVar3 = RectMatrix<double,_3U,_3U>::operator()(in_RSI,local_68,local_6c);
      *pdVar3 = (dVar1 * 1.96) / dVar4;
    }
  }
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x255e53);
  return;
}

Assistant:

void get95percentConfidenceInterval(ResultType& ret) {
      assert(Count_ != 0);
      Mat3x3d sd;
      this->getStdDev(sd);
      for (unsigned int i = 0; i < 3; i++) {
        for (unsigned int j = 0; j < 3; j++) {
          ret(i, j) = 1.960 * sd(i, j) / sqrt(RealType(Count_));
        }
      }
      return;
    }